

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
EncodeConnectivityFromCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          CornerIndex corner_id)

{
  pointer *ppIVar1;
  int *piVar2;
  int32_t *piVar3;
  ulong *puVar4;
  int iVar5;
  EdgebreakerTopologyBitPattern EVar6;
  mapped_type mVar7;
  iterator iVar8;
  CornerTable *pCVar9;
  _Bit_type *p_Var10;
  pointer piVar11;
  iterator iVar12;
  bool bVar13;
  uint uVar14;
  pointer pIVar15;
  mapped_type *pmVar16;
  uint uVar17;
  uint uVar18;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar19;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *pMVar20;
  int iVar21;
  ulong uVar22;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar23;
  EdgebreakerTopologyBitPattern EVar24;
  ulong uVar25;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_80;
  EdgebreakerTopologyBitPattern local_7c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_78;
  int local_74;
  vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
  *local_70;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *local_68;
  int local_60;
  int local_5c;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_58;
  MeshEdgebreakerTraversalPredictiveEncoder *local_50;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_40;
  ulong local_38;
  
  pIVar15 = (this->corner_traversal_stack_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar15) {
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar15;
  }
  local_58 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              *)&this->corner_traversal_stack_;
  iVar8._M_current =
       (this->corner_traversal_stack_).
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_80.value_ = corner_id.value_;
    std::
    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
    ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
              (local_58,iVar8,&local_80);
  }
  else {
    (iVar8._M_current)->value_ = corner_id.value_;
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
  }
  pIVar15 = (this->corner_traversal_stack_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pIVar15) {
    local_60 = (int)((ulong)((long)(this->mesh_->faces_).vector_.
                                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mesh_->faces_).vector_.
                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    local_40 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->processed_connectivity_corners_;
    local_50 = &this->traversal_encoder_;
    local_70 = (vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                *)&(this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_;
    local_48 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->face_to_split_symbol_map_;
    local_68 = this;
    do {
      local_80.value_ = pIVar15[-1].value_;
      if ((local_80.value_ == 0xffffffff) ||
         ((*(ulong *)((long)(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     + (ulong)(local_80.value_ / 0x18 & 0xfffffff8)) >>
           ((ulong)local_80.value_ / 3 & 0x3f) & 1) != 0)) {
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar15 + -1;
      }
      else {
        pMVar20 = this;
        iVar21 = local_60;
        if (0 < local_60) {
          do {
            pMVar20->last_encoded_symbol_id_ = pMVar20->last_encoded_symbol_id_ + 1;
            uVar25 = (ulong)local_80.value_ / 3;
            if ((ulong)local_80.value_ == 0xffffffff) {
              uVar25 = 0xffffffff;
            }
            EVar24 = (EdgebreakerTopologyBitPattern)uVar25;
            puVar4 = (pMVar20->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar25 >> 6)
            ;
            *puVar4 = *puVar4 | 1L << ((byte)uVar25 & 0x3f);
            iVar8._M_current =
                 (pMVar20->processed_connectivity_corners_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (pMVar20->processed_connectivity_corners_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                        (local_40,iVar8,&local_80);
            }
            else {
              (iVar8._M_current)->value_ = local_80.value_;
              (pMVar20->processed_connectivity_corners_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
            this = local_68;
            (pMVar20->traversal_encoder_).last_corner_.value_ = local_80.value_;
            pCVar9 = (pMVar20->corner_table_)._M_t.
                     super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                     .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
            uVar25 = 0xffffffff;
            if ((ulong)local_80.value_ != 0xffffffff) {
              uVar25 = (ulong)*(uint *)(*(long *)&(pCVar9->corner_to_vertex_map_).vector_ +
                                       (ulong)local_80.value_ * 4);
            }
            p_Var10 = (pMVar20->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            iVar5 = (pMVar20->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar25];
            if (((p_Var10[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) == 0) &&
               (puVar4 = p_Var10 + (uVar25 >> 6), *puVar4 = *puVar4 | 1L << ((byte)uVar25 & 0x3f),
               iVar5 == -1)) {
              MeshEdgebreakerTraversalPredictiveEncoder::EncodeSymbol(local_50,TOPOLOGY_C);
              IVar19.value_ = local_80.value_;
              if (local_80.value_ != 0xffffffff) {
                IVar19.value_ = local_80.value_ - 2;
                if (0x55555555 < (local_80.value_ + 1) * -0x55555555) {
                  IVar19.value_ = local_80.value_ + 1;
                }
              }
              this = pMVar20;
              local_80.value_ = IVar19.value_;
              if (IVar19.value_ != 0xffffffff) {
                local_80.value_ =
                     *(uint *)(*(long *)&(((pMVar20->corner_table_)._M_t.
                                           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                           .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                          _M_head_impl)->opposite_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              + (ulong)IVar19.value_ * 4);
              }
            }
            else {
              IVar19.value_ = local_80.value_;
              if (local_80.value_ != 0xffffffff) {
                IVar19.value_ = local_80.value_ - 2;
                if (0x55555555 < (local_80.value_ + 1) * -0x55555555) {
                  IVar19.value_ = local_80.value_ + 1;
                }
              }
              if (IVar19.value_ != 0xffffffff) {
                IVar19.value_ =
                     *(uint *)(*(long *)&(pCVar9->opposite_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              + (ulong)IVar19.value_ * 4);
              }
              IVar23.value_ = local_80.value_;
              if (local_80.value_ != 0xffffffff) {
                IVar23.value_ =
                     ((local_80.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_80.value_;
              }
              if (IVar23.value_ != 0xffffffff) {
                IVar23.value_ =
                     *(uint *)(*(long *)&(pCVar9->opposite_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              + (ulong)IVar23.value_ * 4);
              }
              uVar18 = IVar19.value_ / 3;
              if (IVar19.value_ == 0xffffffff) {
                uVar18 = 0xffffffff;
              }
              uVar17 = IVar23.value_ / 3;
              if (IVar23.value_ == 0xffffffff) {
                uVar17 = 0xffffffff;
              }
              local_78.value_ = IVar19.value_;
              local_74 = iVar21;
              local_5c = iVar5;
              local_38 = uVar25;
              bVar13 = IsRightFaceVisited(local_68,(CornerIndex)local_80.value_);
              if (bVar13) {
                if (IVar19.value_ != 0xffffffff) {
                  CheckAndStoreTopologySplitEvent
                            (this,this->last_encoded_symbol_id_,EVar24,RIGHT_FACE_EDGE,uVar18);
                }
                bVar13 = IsLeftFaceVisited(this,(CornerIndex)local_80.value_);
                if (bVar13) {
                  if (IVar23.value_ != 0xffffffff) {
                    CheckAndStoreTopologySplitEvent
                              (this,this->last_encoded_symbol_id_,EVar24,LEFT_FACE_EDGE,uVar17);
                  }
                  piVar2 = &(this->traversal_encoder_).num_symbols_;
                  *piVar2 = *piVar2 + 1;
                  uVar18 = (this->traversal_encoder_).last_corner_.value_;
                  uVar17 = uVar18;
                  if ((ulong)uVar18 != 0xffffffff) {
                    uVar17 = uVar18 - 2;
                    if (0x55555555 < (uVar18 + 1) * -0x55555555) {
                      uVar17 = uVar18 + 1;
                    }
                  }
                  uVar14 = uVar18;
                  if (uVar18 != 0xffffffff) {
                    uVar14 = ((uVar18 * -0x55555555 < 0x55555556) - 1 | 2) + uVar18;
                  }
                  pCVar9 = (this->traversal_encoder_).corner_table_;
                  uVar25 = 0xffffffff;
                  if (uVar18 != 0xffffffff) {
                    uVar25 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar18].value_;
                  }
                  piVar11 = (this->traversal_encoder_).vertex_valences_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar11[uVar25] = piVar11[uVar25] + -2;
                  uVar25 = 0xffffffff;
                  if (uVar17 != 0xffffffff) {
                    uVar25 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
                  }
                  piVar11[uVar25] = piVar11[uVar25] + -2;
                  uVar25 = 0xffffffff;
                  if (uVar14 != 0xffffffff) {
                    uVar25 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar14].value_;
                  }
                  piVar11[uVar25] = piVar11[uVar25] + -2;
                  EVar24 = (this->traversal_encoder_).prev_symbol_;
                  if (EVar24 != ~TOPOLOGY_C) {
                    iVar12._M_current =
                         (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                         super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    local_7c = EVar24;
                    if (iVar12._M_current ==
                        (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                        super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                      ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                                (local_70,iVar12,&local_7c);
                    }
                    else {
                      *iVar12._M_current = EVar24;
                      (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
                    }
                  }
                  (this->traversal_encoder_).prev_symbol_ = 7;
                  ppIVar1 = &(this->corner_traversal_stack_).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + -1;
                  break;
                }
                MeshEdgebreakerTraversalPredictiveEncoder::EncodeSymbol(local_50,TOPOLOGY_R);
                iVar21 = local_74;
                local_80.value_ = IVar23.value_;
              }
              else {
                bVar13 = IsLeftFaceVisited(this,(CornerIndex)local_80.value_);
                if (!bVar13) {
                  piVar2 = &(this->traversal_encoder_).num_symbols_;
                  *piVar2 = *piVar2 + 1;
                  uVar18 = (this->traversal_encoder_).last_corner_.value_;
                  uVar17 = uVar18;
                  if (uVar18 != 0xffffffff) {
                    uVar17 = uVar18 - 2;
                    if (0x55555555 < (uVar18 + 1) * -0x55555555) {
                      uVar17 = uVar18 + 1;
                    }
                  }
                  if (uVar18 != 0xffffffff) {
                    uVar18 = ((uVar18 * -0x55555555 < 0x55555556) - 1 | 2) + uVar18;
                  }
                  pCVar9 = (this->traversal_encoder_).corner_table_;
                  uVar25 = 0xffffffff;
                  if (uVar17 != 0xffffffff) {
                    uVar25 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
                  }
                  piVar11 = (this->traversal_encoder_).vertex_valences_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar11[uVar25] = piVar11[uVar25] + -1;
                  uVar25 = 0xffffffff;
                  if (uVar18 != 0xffffffff) {
                    uVar25 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar18].value_;
                  }
                  piVar11[uVar25] = piVar11[uVar25] + -1;
                  uVar25 = (ulong)(this->traversal_encoder_).last_corner_.value_;
                  uVar22 = 0xffffffff;
                  if (uVar25 != 0xffffffff) {
                    uVar22 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar25].value_;
                  }
                  piVar11[uVar22] = -1;
                  piVar3 = &(this->traversal_encoder_).num_split_symbols_;
                  *piVar3 = *piVar3 + 1;
                  EVar6 = (this->traversal_encoder_).prev_symbol_;
                  if (EVar6 != ~TOPOLOGY_C) {
                    iVar12._M_current =
                         (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                         super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    local_7c = EVar6;
                    if (iVar12._M_current ==
                        (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                        super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                      ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                                (local_70,iVar12,&local_7c);
                    }
                    else {
                      *iVar12._M_current = EVar6;
                      (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
                    }
                  }
                  this->num_split_symbols_ = this->num_split_symbols_ + 1;
                  (this->traversal_encoder_).prev_symbol_ = 1;
                  if (local_5c != -1) {
                    uVar22 = (ulong)(this->vertex_hole_id_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[local_38];
                    uVar25 = uVar22 + 0x3f;
                    if (-1 < (long)uVar22) {
                      uVar25 = uVar22;
                    }
                    if (((this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar25 >> 6) +
                          (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff] >> (uVar22 & 0x3f) & 1) == 0) {
                      EncodeHole(this,(CornerIndex)local_80.value_,false);
                    }
                  }
                  mVar7 = local_68->last_encoded_symbol_id_;
                  local_7c = EVar24;
                  pmVar16 = std::__detail::
                            _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[](local_48,(key_type *)&local_7c);
                  this = local_68;
                  *pmVar16 = mVar7;
                  iVar8._M_current =
                       (local_68->corner_traversal_stack_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  iVar8._M_current[-1].value_ = IVar23.value_;
                  if (iVar8._M_current ==
                      (local_68->corner_traversal_stack_).
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    ::
                    _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                              (local_58,iVar8,&local_78);
                  }
                  else {
                    (iVar8._M_current)->value_ = local_78.value_;
                    (local_68->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                  }
                  break;
                }
                if (IVar23.value_ != 0xffffffff) {
                  CheckAndStoreTopologySplitEvent
                            (this,this->last_encoded_symbol_id_,EVar24,LEFT_FACE_EDGE,uVar17);
                }
                iVar21 = local_74;
                piVar2 = &(this->traversal_encoder_).num_symbols_;
                *piVar2 = *piVar2 + 1;
                uVar18 = (this->traversal_encoder_).last_corner_.value_;
                uVar17 = uVar18;
                if ((ulong)uVar18 != 0xffffffff) {
                  uVar17 = uVar18 - 2;
                  if (0x55555555 < (uVar18 + 1) * -0x55555555) {
                    uVar17 = uVar18 + 1;
                  }
                }
                uVar14 = uVar18;
                if (uVar18 != 0xffffffff) {
                  uVar14 = ((uVar18 * -0x55555555 < 0x55555556) - 1 | 2) + uVar18;
                }
                pCVar9 = (this->traversal_encoder_).corner_table_;
                uVar25 = 0xffffffff;
                if (uVar18 != 0xffffffff) {
                  uVar25 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar18].value_;
                }
                piVar11 = (this->traversal_encoder_).vertex_valences_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar11[uVar25] = piVar11[uVar25] + -1;
                uVar25 = 0xffffffff;
                if (uVar17 != 0xffffffff) {
                  uVar25 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
                }
                piVar11[uVar25] = piVar11[uVar25] + -2;
                uVar25 = 0xffffffff;
                if (uVar14 != 0xffffffff) {
                  uVar25 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar14].value_;
                }
                piVar11[uVar25] = piVar11[uVar25] + -1;
                EVar24 = (this->traversal_encoder_).prev_symbol_;
                if (EVar24 != ~TOPOLOGY_C) {
                  iVar12._M_current =
                       (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                       super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_7c = EVar24;
                  if (iVar12._M_current ==
                      (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                    ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                              (local_70,iVar12,&local_7c);
                  }
                  else {
                    *iVar12._M_current = EVar24;
                    (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar12._M_current + 1;
                  }
                }
                (this->traversal_encoder_).prev_symbol_ = 3;
                local_80.value_ = local_78.value_;
              }
            }
            iVar21 = iVar21 + -1;
            pMVar20 = this;
          } while (iVar21 != 0);
        }
      }
      pIVar15 = (this->corner_traversal_stack_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != pIVar15);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivityFromCorner(
    CornerIndex corner_id) {
  corner_traversal_stack_.clear();
  corner_traversal_stack_.push_back(corner_id);
  const int num_faces = mesh_->num_faces();
  while (!corner_traversal_stack_.empty()) {
    // Currently processed corner.
    corner_id = corner_traversal_stack_.back();
    // Make sure the face hasn't been visited yet.
    if (corner_id == kInvalidCornerIndex ||
        visited_faces_[corner_table_->Face(corner_id).value()]) {
      // This face has been already traversed.
      corner_traversal_stack_.pop_back();
      continue;
    }
    int num_visited_faces = 0;
    while (num_visited_faces < num_faces) {
      // Mark the current face as visited.
      ++num_visited_faces;
      ++last_encoded_symbol_id_;

      const FaceIndex face_id = corner_table_->Face(corner_id);
      visited_faces_[face_id.value()] = true;
      processed_connectivity_corners_.push_back(corner_id);
      traversal_encoder_.NewCornerReached(corner_id);
      const VertexIndex vert_id = corner_table_->Vertex(corner_id);
      const bool on_boundary = (vertex_hole_id_[vert_id.value()] != -1);
      if (!IsVertexVisited(vert_id)) {
        // A new unvisited vertex has been reached. We need to store its
        // position difference using next, prev, and opposite vertices.
        visited_vertex_ids_[vert_id.value()] = true;
        if (!on_boundary) {
          // If the vertex is on boundary it must correspond to an unvisited
          // hole and it will be encoded with TOPOLOGY_S symbol later).
          traversal_encoder_.EncodeSymbol(TOPOLOGY_C);
          // Move to the right triangle.
          corner_id = GetRightCorner(corner_id);
          continue;
        }
      }
      // The current vertex has been already visited or it was on a boundary.
      // We need to determine whether we can visit any of it's neighboring
      // faces.
      const CornerIndex right_corner_id = GetRightCorner(corner_id);
      const CornerIndex left_corner_id = GetLeftCorner(corner_id);
      const FaceIndex right_face_id = corner_table_->Face(right_corner_id);
      const FaceIndex left_face_id = corner_table_->Face(left_corner_id);
      if (IsRightFaceVisited(corner_id)) {
        // Right face has been already visited.
        // Check whether there is a topology split event.
        if (right_face_id != kInvalidFaceIndex) {
          CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                          face_id.value(), RIGHT_FACE_EDGE,
                                          right_face_id.value());
        }
        if (IsLeftFaceVisited(corner_id)) {
          // Both neighboring faces are visited. End reached.
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_E);
          corner_traversal_stack_.pop_back();
          break;  // Break from the while (num_visited_faces < num_faces) loop.
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_R);
          // Go to the left face.
          corner_id = left_corner_id;
        }
      } else {
        // Right face was not visited.
        if (IsLeftFaceVisited(corner_id)) {
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_L);
          // Left face visited, go to the right one.
          corner_id = right_corner_id;
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_S);
          ++num_split_symbols_;
          // Both neighboring faces are unvisited, we need to visit both of
          // them.
          if (on_boundary) {
            // The tip vertex is on a hole boundary. If the hole hasn't been
            // visited yet we need to encode it.
            const int hole_id = vertex_hole_id_[vert_id.value()];
            if (!visited_holes_[hole_id]) {
              EncodeHole(corner_id, false);
            }
          }
          face_to_split_symbol_map_[face_id.value()] = last_encoded_symbol_id_;
          // Split the traversal.
          // First make the top of the current corner stack point to the left
          // face (this one will be processed second).
          corner_traversal_stack_.back() = left_corner_id;
          // Add a new corner to the top of the stack (right face needs to
          // be traversed first).
          corner_traversal_stack_.push_back(right_corner_id);
          // Break from the while (num_visited_faces < num_faces) loop.
          break;
        }
      }
    }
  }
  return true;  // All corners have been processed.
}